

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_viewport.cpp
# Opt level: O3

bool __thiscall ON_Viewport::Extents(ON_Viewport *this,double angle,ON_BoundingBox *bbox)

{
  double dVar1;
  double dVar2;
  bool bVar3;
  double dVar4;
  bool bVar5;
  bool bVar6;
  int iVar7;
  int y_index;
  int z_index;
  bool bVar8;
  ulong uVar9;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  double dVar10;
  double dVar11;
  ON_3dVector camY;
  ON_3dVector camX;
  ON_3dVector box_corner;
  ON_3dPoint center;
  undefined1 local_108 [16];
  double local_f8;
  double local_e8;
  ON_3dVector local_b8;
  ON_3dVector local_98;
  ON_3dVector local_78;
  ON_3dPoint local_60;
  ON_3dPoint local_48;
  
  bVar5 = ON_BoundingBox::IsValid(bbox);
  if (bVar5) {
    iVar7 = (*(this->super_ON_Geometry).super_ON_Object._vptr_ON_Object[6])(this,0);
    bVar5 = false;
    if ((char)iVar7 != '\0') {
      local_98.z = (this->m_CamX).z;
      local_98.x = (this->m_CamX).x;
      local_98.y = (this->m_CamX).y;
      local_b8.z = (this->m_CamY).z;
      local_b8.x = (this->m_CamY).x;
      local_b8.y = (this->m_CamY).y;
      ON_BoundingBox::Center(&local_60,bbox);
      iVar7 = 0;
      dVar10 = 0.0;
      local_108 = ZEXT816(0);
      local_e8 = 0.0;
      local_f8 = 0.0;
      bVar5 = true;
      do {
        bVar3 = bVar5;
        y_index = 0;
        bVar5 = true;
        do {
          bVar6 = bVar5;
          z_index = 0;
          dVar11 = dVar10;
          bVar5 = true;
          do {
            bVar8 = bVar5;
            ON_BoundingBox::Corner(&local_48,bbox,iVar7,y_index,z_index);
            ON_3dVector::ON_3dVector(&local_78,&local_48);
            dVar1 = ON_3dVector::operator*(&local_98,&local_78);
            dVar2 = ON_3dVector::operator*(&local_b8,&local_78);
            dVar10 = dVar2;
            if (z_index == 0 && (y_index == 0 && iVar7 == 0)) {
              local_108._8_4_ = extraout_XMM0_Dc;
              local_108._0_8_ = dVar2;
              local_108._12_4_ = extraout_XMM0_Dd;
              local_f8 = dVar1;
              local_e8 = dVar1;
            }
            else {
              dVar4 = dVar1;
              if ((dVar1 <= local_e8) && (dVar4 = local_e8, dVar1 < local_f8)) {
                local_f8 = dVar1;
              }
              local_e8 = dVar4;
              if ((dVar2 <= dVar11) && (dVar10 = dVar11, dVar2 < (double)local_108._0_8_)) {
                local_108._8_4_ = extraout_XMM0_Dc;
                local_108._0_8_ = dVar2;
                local_108._12_4_ = extraout_XMM0_Dd;
              }
            }
            z_index = 1;
            dVar11 = dVar10;
            bVar5 = false;
          } while (bVar8);
          y_index = 1;
          bVar5 = false;
        } while (bVar6);
        iVar7 = 1;
      } while (bVar3);
      dVar11 = dVar10 - (double)local_108._0_8_;
      if (dVar10 - (double)local_108._0_8_ <= local_e8 - local_f8) {
        dVar11 = local_e8 - local_f8;
      }
      if (dVar11 <= 1.490116119385e-08) {
        ON_BoundingBox::Diagonal(&local_78,bbox);
        dVar11 = ON_3dVector::MaximumCoordinate(&local_78);
      }
      uVar9 = -(ulong)(1.490116119385e-08 < dVar11 * 0.5);
      bVar5 = Extents(this,angle,&local_60,
                      (double)(~uVar9 & 0x3ff0000000000000 | (ulong)(dVar11 * 0.5) & uVar9));
    }
  }
  else {
    bVar5 = false;
  }
  return bVar5;
}

Assistant:

bool ON_Viewport::Extents( double angle, const ON_BoundingBox& bbox )
{
  double radius;
  double x, y, xmin, xmax, ymin, ymax;
  int i,j,k;

  if ( !bbox.IsValid() || !IsValid() )
    return false;
  ON_3dVector camX = CameraX();
  ON_3dVector camY = CameraY();
  ON_3dPoint center = bbox.Center();
  xmin=xmax=ymin=ymax=0.0;
  for (i=0;i<2;i++) for (j=0;j<2;j++) for (k=0;k<2;k++) {
    ON_3dVector box_corner = bbox.Corner(i,j,k);
    x = camX*box_corner;
    y = camY*box_corner;
    if ( i==0&&j==0&&k==0) {
      xmin=xmax=x;
      ymin=ymax=y;
    }
    else {
      if ( x > xmax) xmax=x; else if (x < xmin) xmin = x;
      if ( y > ymax) ymax=y; else if (y < ymin) ymin = y;
    }
  }
  radius = xmax-xmin;
  if ( ymax-ymin > radius )
    radius = ymax-ymin;
  if ( radius <= ON_SQRT_EPSILON ) {
    radius = bbox.Diagonal().MaximumCoordinate();
  }
  radius *= 0.5;
  if ( radius <= ON_SQRT_EPSILON )
    radius = 1.0;
  return Extents( angle, center, radius );
}